

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cord.cc
# Opt level: O0

CharIterator * __thiscall
absl::lts_20250127::Cord::Find(CharIterator *__return_storage_ptr__,Cord *this,string_view needle)

{
  Cord *pCVar1;
  bool bVar2;
  size_type sVar3;
  size_t sVar4;
  char *pcVar5;
  char *pcVar6;
  long lVar7;
  CharIterator *pCVar8;
  size_t *psVar9;
  byte bVar10;
  string_view rhs;
  string_view needle_00;
  ChunkIterator in_stack_fffffffffffffe58;
  CharIterator local_c8;
  Cord *local_30;
  size_t local_28;
  Cord *local_20;
  Cord *this_local;
  string_view needle_local;
  
  needle_local._M_len = (size_t)needle._M_str;
  this_local = (Cord *)needle._M_len;
  bVar10 = 0;
  local_20 = this;
  bVar2 = std::basic_string_view<char,_std::char_traits<char>_>::empty
                    ((basic_string_view<char,_std::char_traits<char>_> *)&this_local);
  if (bVar2) {
    char_begin(__return_storage_ptr__,this);
  }
  else {
    sVar3 = std::basic_string_view<char,_std::char_traits<char>_>::size
                      ((basic_string_view<char,_std::char_traits<char>_> *)&this_local);
    sVar4 = size(this);
    if (sVar4 < sVar3) {
      char_end(__return_storage_ptr__,this);
    }
    else {
      pcVar5 = (char *)std::basic_string_view<char,_std::char_traits<char>_>::size
                                 ((basic_string_view<char,_std::char_traits<char>_> *)&this_local);
      pcVar6 = (char *)size(this);
      if (pcVar5 == pcVar6) {
        local_30 = this_local;
        local_28 = needle_local._M_len;
        rhs._M_str = pcVar6;
        rhs._M_len = needle_local._M_len;
        bVar2 = lts_20250127::operator==((lts_20250127 *)this,this_local,rhs);
        if (bVar2) {
          char_begin(__return_storage_ptr__,this);
        }
        else {
          char_end(__return_storage_ptr__,this);
        }
      }
      else {
        char_begin(&local_c8,this);
        sVar4 = needle_local._M_len;
        pCVar1 = this_local;
        pCVar8 = &local_c8;
        psVar9 = (size_t *)&stack0xfffffffffffffe58;
        for (lVar7 = 0x13; lVar7 != 0; lVar7 = lVar7 + -1) {
          *psVar9 = (pCVar8->chunk_iterator_).current_chunk_._M_len;
          pCVar8 = (CharIterator *)((long)pCVar8 + ((ulong)bVar10 * -2 + 1) * 8);
          psVar9 = psVar9 + (ulong)bVar10 * -2 + 1;
        }
        needle_00._M_str = (char *)sVar4;
        needle_00._M_len = (size_t)pCVar1;
        FindImpl(__return_storage_ptr__,this,(CharIterator)in_stack_fffffffffffffe58,needle_00);
      }
    }
  }
  return __return_storage_ptr__;
}

Assistant:

absl::Cord::CharIterator absl::Cord::Find(absl::string_view needle) const {
  if (needle.empty()) {
    return char_begin();
  }
  if (needle.size() > size()) {
    return char_end();
  }
  if (needle.size() == size()) {
    return *this == needle ? char_begin() : char_end();
  }
  return FindImpl(char_begin(), needle);
}